

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggx.cpp
# Opt level: O0

vec3 __thiscall ggx::sample(ggx *this,vec3 *view_dir,vec2 *random_parameters)

{
  undefined4 uVar1;
  vec3 *v;
  float fVar2;
  float fVar3;
  float fVar4;
  vec<3,_float,_(glm::precision)0> vVar5;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 aVar6;
  undefined8 local_90;
  float local_88;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_80;
  undefined1 local_70 [20];
  vec<3,_float,_(glm::precision)0> local_5c;
  undefined1 local_50 [8];
  vec3 h;
  float r;
  float phi;
  float u2;
  float u1;
  vec2 *random_parameters_local;
  vec3 *view_dir_local;
  ggx *this_local;
  vec3 l;
  
  fVar2 = (random_parameters->field_0).field_0.y;
  fVar4 = (random_parameters->field_0).field_0.x * 6.2831855;
  fVar3 = this->_alpha;
  v = view_dir;
  fVar2 = sqrtf(fVar2 / (1.0 - fVar2));
  fVar3 = fVar3 * fVar2;
  h.field_0.field_0.z = fVar3;
  fVar2 = cosf(fVar4);
  uVar1 = h.field_0.field_0.z;
  fVar4 = sinf(fVar4);
  glm::vec<3,_float,_(glm::precision)0>::vec(&local_5c,fVar3 * fVar2,(float)uVar1 * fVar4,1.0);
  local_70._0_12_ = (undefined1  [12])glm::normalize<3,float,(glm::precision)0,glm::vec>(&local_5c);
  h.field_0.field_0.x = (float)local_70._8_4_;
  local_50 = (undefined1  [8])local_70._0_8_;
  vVar5 = glm::operator-((glm *)view_dir,v);
  local_88 = vVar5.field_0._8_4_;
  local_80.field_0.z = local_88;
  local_90 = vVar5.field_0._0_8_;
  local_80._0_8_ = local_90;
  aVar6.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3_0
        )glm::reflect<3,float,(glm::precision)0,glm::vec>
                   ((vec<3,_float,_(glm::precision)0> *)&local_80.field_0,
                    (vec<3,_float,_(glm::precision)0> *)local_50);
  return (anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3)
         (anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3)aVar6.field_0;
}

Assistant:

glm::vec3 ggx::sample(const glm::vec3 &view_dir, const glm::vec2 &random_parameters) const
{
  float u1 = random_parameters.x;
  float u2 = random_parameters.y;

  // This is classic GGX sampling, it is rewritten to solve for X-axis side of right triangle. For simplicity,
  // we assume that other side is equal to 1. Hypotenuse is equal to sqrt(r^2+1). In that case:
  //   cos(theta) = (1) / sqrt(r^2+1)
  // Now we can transform standard GGX sampling method by comparing that cos(theta) and cos(theta) defined by
  // sampling method. In the end we get:
  //   r = alpha * sqrt(u/(1-u))

  const float phi = 2.0f * pi * u1;
  const float r = _alpha * sqrtf(u2/(1.0f - u2));

  const glm::vec3 h = glm::normalize(glm::vec3(r*cosf(phi), r*sinf(phi), 1.0f));
  const glm::vec3 l = glm::reflect(-view_dir, h);

  return l;
}